

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O0

Matrix<double,_6,_1,_0,_6,_1> * iDynTree::vech(Matrix<double,_3,_3,_1,_3,_3> *mat)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  Matrix<double,_6,_1,_0,_6,_1> *in_RDI;
  Matrix<double,_6,_1,_0,_6,_1> *vec;
  Index in_stack_ffffffffffffffa8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *in_stack_ffffffffffffffb0;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *this;
  
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)0x6a13b0);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x6a13c1);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)*pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffffa8);
  *pSVar3 = (Scalar)this;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffffa8,0x6a13f6);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffffa8);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffffa8,0x6a142c);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffffa8);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffffa8,0x6a1461);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffffa8);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffffa8,0x6a1498);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffffa8);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffffa8,0x6a14cd);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffffa8);
  *pSVar3 = dVar1;
  return in_RDI;
}

Assistant:

Eigen::Matrix<double, 6, 1> vech(const Eigen::Matrix<double, 3, 3, Eigen::RowMajor> & mat)
{
    Eigen::Matrix<double, 6, 1> vec;

    vec(0) = mat(0,0);
    vec(1) = mat(0,1);
    vec(2) = mat(0,2);
    vec(3) = mat(1,1);
    vec(4) = mat(2,1);
    vec(5) = mat(2,2);

    return vec;
}